

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

bool Imf_2_5::Attribute::knownType(char *typeName)

{
  byte bVar1;
  Lock lock;
  LockedTypeMap *tMap;
  map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
  *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Mutex *in_stack_ffffffffffffffb8;
  _Self in_stack_ffffffffffffffc0;
  _Self local_28 [3];
  LockedTypeMap *local_10;
  
  local_10 = anon_unknown_0::typeMap();
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_ffffffffffffffc0._M_node,in_stack_ffffffffffffffb8,
             (bool)in_stack_ffffffffffffffb7);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x853b2a);
  std::
  map<const_char_*,_Imf_2_5::Attribute_*(*)(),_Imf_2_5::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_2_5::Attribute_*(*)()>_>_>
  ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=(local_28,(_Self *)&stack0xffffffffffffffc0);
  IlmThread_2_5::Lock::~Lock((Lock *)CONCAT17(bVar1,in_stack_ffffffffffffffb0));
  return (bool)(bVar1 & 1);
}

Assistant:

bool		
Attribute::knownType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap();
    Lock lock (tMap.mutex);

    return tMap.find (typeName) != tMap.end();
}